

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformDefaultAction<ot::commissioner::Error(ot::commissioner::CommissionerDataset_const&)>
          (FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)>
           *func_mocker,ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<ot::commissioner::Error> *this;
  undefined1 local_70 [40];
  undefined1 local_48 [40];
  
  this = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  FunctionMocker<ot::commissioner::Error_(const_ot::commissioner::CommissionerDataset_&)>::
  PerformDefaultAction((Result *)local_70,func_mocker,args,call_description);
  ot::commissioner::Error::Error((Error *)local_48,(Error *)local_70);
  ActionResultHolder(this,(Wrapper *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::~string((string *)(local_70 + 8));
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }